

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

slab * slab_get_with_order(slab_cache *cache,uint8_t order)

{
  slab *slab;
  small_stats *psVar1;
  size_t *psVar2;
  long *plVar3;
  char cVar4;
  uint8_t uVar5;
  long lVar6;
  long lVar7;
  rlist *prVar8;
  byte bVar9;
  uint uVar10;
  long lVar11;
  rlist *prVar12;
  rlist *prVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  rlist **pprVar17;
  long lVar18;
  
  if (cache->order_max < order) {
    __assert_fail("order <= cache->order_max",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                  ,0xe0,"struct slab *slab_get_with_order(struct slab_cache *, uint8_t)");
  }
  prVar13 = &cache->orders[order].slabs;
  prVar8 = cache->orders[order].slabs.next;
  if ((prVar8 == prVar13) && (prVar8 == cache->orders[order].slabs.prev)) {
    uVar14 = (ulong)order;
    lVar18 = uVar14 * -0x20 + -0x38;
    lVar16 = uVar14 * -0x20 + -0x30;
    lVar11 = uVar14 * 0x20 + 0x50;
    lVar15 = uVar14 * 0x20 + 0x58;
    do {
      if ((ulong)cache->order_max * 0x20 + lVar18 == -0x38) {
        prVar8 = (rlist *)slab_map(cache->arena);
        if (prVar8 == (rlist *)0x0) {
          return (slab *)0x0;
        }
        prVar13 = (rlist *)((long)cache - lVar16);
        pprVar17 = (rlist **)((long)cache - lVar18);
        uVar5 = cache->order_max;
        prVar12 = (rlist *)(ulong)cache->arena->slab_size;
        *(undefined4 *)&prVar8[2].next = 0xeec0ffee;
        *(uint8_t *)((long)&prVar8[2].next + 4) = uVar5;
        *(undefined1 *)((long)&prVar8[2].next + 5) = 0;
        prVar8[2].prev = prVar12;
        memset(prVar8 + 3,0x50,(size_t)(prVar12 + -3));
        prVar8->prev = &(cache->allocated).slabs;
        prVar8->next = (cache->allocated).slabs.next;
        (cache->allocated).slabs.next = prVar8;
        prVar8->next->prev = prVar8;
        psVar2 = &(cache->allocated).stats.total;
        *psVar2 = (long)&prVar12->prev + *psVar2;
        prVar8[1].prev = prVar13;
        prVar8[1].next = *(rlist **)((long)cache->orders + lVar15 + -0x50);
        *(rlist **)((long)cache->orders + lVar15 + -0x50) = prVar8 + 1;
        (prVar8[1].next)->prev = prVar8 + 1;
        plVar3 = (long *)((long)(cache->orders + -2) + lVar15);
        *plVar3 = (long)&prVar12->prev + *plVar3;
        goto LAB_00104e1b;
      }
      lVar6 = *(long *)((long)cache->orders + lVar15 + -0x30);
      lVar16 = lVar16 + -0x20;
      if ((long)cache->orders + lVar11 + -0x30 != lVar6) break;
      lVar18 = lVar18 + -0x20;
      lVar11 = lVar11 + 0x20;
      lVar7 = lVar15 + -0x38;
      lVar15 = lVar15 + 0x20;
    } while (lVar6 == *(long *)((long)cache->orders + lVar7));
    prVar13 = (rlist *)((long)cache - lVar16);
  }
  pprVar17 = &prVar13->next;
LAB_00104e1b:
  prVar8 = *pprVar17;
  *pprVar17 = prVar8->next;
  prVar8->next->prev = prVar13;
  prVar8->prev = prVar8;
  prVar8->next = prVar8;
  slab = (slab *)(prVar8 + -1);
  if (*(uint8_t *)((long)&prVar8[1].next + 4) != order) {
    prVar13[1].next = (rlist *)((long)prVar13[1].next - (long)prVar8[1].prev);
    do {
      cVar4 = *(char *)((long)&prVar8[1].next + 4);
      if (cVar4 == '\0') {
        __assert_fail("slab->order > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                      ,0x8d,"struct slab *slab_split(struct slab_cache *, struct slab *)");
      }
      bVar9 = cVar4 - 1;
      if (cache->order_max < bVar9) {
        __assert_fail("order <= cache->order_max",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                      ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
      }
      uVar10 = *(int *)&cache->order0_size_lb + (uint)bVar9;
      prVar13 = (rlist *)(1L << ((byte)uVar10 & 0x3f));
      *(undefined4 *)&prVar8[1].next = 0xeec0ffee;
      *(byte *)((long)&prVar8[1].next + 4) = bVar9;
      *(undefined1 *)((long)&prVar8[1].next + 5) = 0;
      prVar8[1].prev = prVar13;
      uVar14 = (ulong)slab ^ 1L << ((ulong)uVar10 & 0x3f);
      *(undefined4 *)(uVar14 + 0x28) = 0xeec0ffee;
      *(byte *)(uVar14 + 0x2c) = bVar9;
      *(undefined1 *)(uVar14 + 0x2d) = 0;
      *(rlist **)(uVar14 + 0x20) = prVar13;
      *(slab_list **)(uVar14 + 0x10) = cache->orders + bVar9;
      *(rlist **)(uVar14 + 0x18) = cache->orders[bVar9].slabs.next;
      cache->orders[bVar9].slabs.next = (rlist *)(uVar14 + 0x10);
      **(long **)(uVar14 + 0x18) = (long)(uVar14 + 0x10);
      psVar2 = &cache->orders[bVar9].stats.total;
      *psVar2 = (long)&prVar13->prev + *psVar2;
      bVar9 = *(byte *)((long)&prVar8[1].next + 4);
    } while (bVar9 != order);
    psVar2 = &cache->orders[bVar9].stats.total;
    *psVar2 = (long)&(prVar8[1].prev)->prev + *psVar2;
  }
  prVar13 = prVar8[1].prev;
  psVar1 = &(cache->allocated).stats;
  psVar1->used = (long)&prVar13->prev + psVar1->used;
  bVar9 = *(byte *)((long)&prVar8[1].next + 4);
  psVar1 = &cache->orders[bVar9].stats;
  psVar1->used = (long)&prVar13->prev + psVar1->used;
  *(byte *)((long)&prVar8[1].next + 5) = bVar9 + 1;
  slab_assert(cache,slab);
  return slab;
}

Assistant:

struct slab *
slab_get_with_order(struct slab_cache *cache, uint8_t order)
{
	assert(order <= cache->order_max);
	struct slab *slab;
	/* Search for the first available slab. If a slab
	 * of a bigger size is found, it can be split.
	 * If cache->order_max is reached and there are no
	 * free slabs, allocate a new one on arena.
	 */
	struct slab_list *list= &cache->orders[order];

	for ( ; rlist_empty(&list->slabs); list++) {
		if (list == cache->orders + cache->order_max) {
			slab = slab_map(cache->arena);
			if (slab == NULL)
				return NULL;
			slab_create(slab, cache->order_max,
				    cache->arena->slab_size);
			slab_poison(slab);
			slab_list_add(&cache->allocated, slab,
				      next_in_cache);
			slab_list_add(list, slab, next_in_list);
			break;
		}
	}
	slab = rlist_shift_entry(&list->slabs, struct slab, next_in_list);
	if (slab->order != order) {
		/*
		 * Do not "bill" the size of this slab to this
		 * order, to prevent double accounting of the
		 * same memory.
		 */
		list->stats.total -= slab->size;
		/* Get a slab of the right order. */
		do {
			slab = slab_split(cache, slab);
		} while (slab->order != order);
		/*
		 * Count the slab in this order. The buddy is
		 * already taken care of by slab_split.
		 */
		cache->orders[slab->order].stats.total += slab->size;
	}
	slab_set_used(cache, slab);
	slab_assert(cache, slab);
	return slab;
}